

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O3

int decode_profile_tier_level(GetBitContext *gb,PTLCommon *ptl)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t re_size_plus8;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar11 = gb->index;
  iVar4 = -1;
  if (0x57 < (int)(gb->size_in_bits - uVar11)) {
    puVar3 = gb->buffer;
    uVar8 = *(uint *)(puVar3 + (uVar11 >> 3));
    uVar7 = gb->size_in_bits_plus8;
    uVar10 = uVar11 + 2;
    uVar6 = uVar10;
    if (uVar7 < uVar10) {
      uVar6 = uVar7;
    }
    gb->index = uVar6;
    uVar10 = uVar6 + (uVar10 < uVar7);
    ptl->profile_space =
         (byte)(((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
                << ((byte)uVar11 & 7)) >> 0x1e);
    uVar1 = puVar3[uVar6 >> 3];
    gb->index = uVar10;
    ptl->tier_flag = (byte)(uVar1 << ((byte)uVar6 & 7)) >> 7;
    uVar11 = *(uint *)(puVar3 + (uVar10 >> 3));
    uVar8 = (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
            ((byte)uVar10 & 7);
    uVar11 = uVar10 + 5;
    if (uVar7 < uVar10 + 5) {
      uVar11 = uVar7;
    }
    gb->index = uVar11;
    ptl->profile_idc = (byte)(uVar8 >> 0x1b);
    switch(uVar8 >> 0x1b) {
    case 1:
      decode_profile_tier_level_cold_4();
      break;
    case 2:
      decode_profile_tier_level_cold_3();
      break;
    case 3:
      decode_profile_tier_level_cold_2();
      break;
    case 4:
      decode_profile_tier_level_cold_1();
      break;
    default:
      fprintf(_stderr,"Unknown HEVC profile: %d\n");
    }
    uVar9 = (ulong)ptl->profile_idc;
    uVar5 = 0;
    do {
      uVar11 = gb->index;
      bVar2 = gb->buffer[uVar11 >> 3];
      gb->index = uVar11 + (uVar11 < gb->size_in_bits_plus8);
      uVar11 = ((uint)bVar2 << ((byte)uVar11 & 7)) >> 7 & 1;
      ptl->profile_compatibility_flag[uVar5] = (uint8_t)uVar11;
      if (((uVar5 != 0) && ((char)uVar9 == '\0')) && (uVar11 != 0)) {
        ptl->profile_idc = (uint8_t)uVar5;
        uVar9 = uVar5 & 0xffffffff;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x20);
    uVar11 = gb->index;
    puVar3 = gb->buffer;
    uVar8 = gb->size_in_bits_plus8;
    uVar1 = puVar3[uVar11 >> 3];
    uVar7 = uVar11 + (uVar11 < uVar8);
    gb->index = uVar7;
    ptl->progressive_source_flag = (byte)(uVar1 << ((byte)uVar11 & 7)) >> 7;
    uVar11 = uVar11 + (uVar11 < uVar8) + (uint)(uVar7 < uVar8);
    uVar1 = puVar3[uVar7 >> 3];
    gb->index = uVar11;
    ptl->interlaced_source_flag = (byte)(uVar1 << ((byte)uVar7 & 7)) >> 7;
    uVar1 = puVar3[uVar11 >> 3];
    uVar7 = uVar11 + (uVar11 < uVar8);
    gb->index = uVar7;
    ptl->non_packed_constraint_flag = (byte)(uVar1 << ((byte)uVar11 & 7)) >> 7;
    ptl->frame_only_constraint_flag = (byte)(puVar3[uVar7 >> 3] << ((byte)uVar7 & 7)) >> 7;
    uVar11 = uVar11 + (uVar11 < uVar8) + (uint)(uVar7 < uVar8) + 0x10;
    if (uVar8 < uVar11) {
      uVar11 = uVar8;
    }
    uVar7 = uVar11 + 0x10;
    if (uVar8 < uVar11 + 0x10) {
      uVar7 = uVar8;
    }
    uVar11 = uVar7 + 0xc;
    if (uVar8 < uVar7 + 0xc) {
      uVar11 = uVar8;
    }
    gb->index = uVar11;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int decode_profile_tier_level(GetBitContext *gb, PTLCommon *ptl)
{
    int i;

    if (get_bits_left(gb) < 2 + 1 + 5 + 32 + 4 + 16 + 16 + 12)
        return -1;
    ptl->profile_space = (uint8_t)get_bits(gb, 2);
    ptl->tier_flag     = (uint8_t)get_bits1(gb);
    ptl->profile_idc   = (uint8_t)get_bits(gb, 5);
    if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN)
        fprintf(stderr, "Main profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_10)
        fprintf(stderr, "Main 10 profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_STILL_PICTURE)
        fprintf(stderr, "Main Still Picture profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_REXT)
        fprintf(stderr, "Range Extension profile bitstream\n");
    else
        fprintf(stderr, "Unknown HEVC profile: %d\n", ptl->profile_idc);

    for (i = 0; i < 32; i++) {
        ptl->profile_compatibility_flag[i] = (uint8_t)get_bits1(gb);

        if (ptl->profile_idc == 0 && i > 0 && ptl->profile_compatibility_flag[i])
            ptl->profile_idc = (uint8_t)i;
    }
    ptl->progressive_source_flag    = (uint8_t)get_bits1(gb);
    ptl->interlaced_source_flag     = (uint8_t)get_bits1(gb);
    ptl->non_packed_constraint_flag = (uint8_t)get_bits1(gb);
    ptl->frame_only_constraint_flag = (uint8_t)get_bits1(gb);

    skip_bits(gb, 16); // XXX_reserved_zero_44bits[0..15]
    skip_bits(gb, 16); // XXX_reserved_zero_44bits[16..31]
    skip_bits(gb, 12); // XXX_reserved_zero_44bits[32..43]

    return 0;
}